

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCPackRPMGenerator.cxx
# Opt level: O3

int __thiscall
cmCPackRPMGenerator::PackageOnePack
          (cmCPackRPMGenerator *this,string *initialToplevel,string *packageName)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer pcVar2;
  cmCPackLog *this_00;
  _Alloc_hider msg;
  bool bVar3;
  char *pcVar4;
  long *plVar5;
  size_t length;
  size_type *psVar6;
  int iVar7;
  string component_path;
  string outputFileName;
  string localToplevel;
  string packageFileName;
  ostringstream cmCPackLog_msg;
  allocator local_249;
  long *local_248 [2];
  long local_238 [2];
  string local_228;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_208;
  long *local_1e8 [2];
  long local_1d8 [2];
  string local_1c8;
  undefined1 local_1a8 [112];
  ios_base local_138 [264];
  
  local_1e8[0] = local_1d8;
  pcVar2 = (initialToplevel->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_1e8,pcVar2,pcVar2 + initialToplevel->_M_string_length);
  cmsys::SystemTools::GetParentDirectory(&local_1c8,&(this->super_cmCPackGenerator).toplevel);
  paVar1 = &local_228.field_2;
  local_228._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_228,"CPACK_PACKAGE_FILE_NAME","")
  ;
  pcVar4 = cmCPackGenerator::GetOption(&this->super_cmCPackGenerator,&local_228);
  std::__cxx11::string::string((string *)local_248,pcVar4,&local_249);
  (*(this->super_cmCPackGenerator).super_cmObject._vptr_cmObject[9])
            (local_1a8,this,local_248,packageName,1);
  (*(this->super_cmCPackGenerator).super_cmObject._vptr_cmObject[5])(this);
  plVar5 = (long *)std::__cxx11::string::append(local_1a8);
  psVar6 = (size_type *)(plVar5 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar5 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar6) {
    local_208.field_2._M_allocated_capacity = *psVar6;
    local_208.field_2._8_8_ = plVar5[3];
    local_208._M_dataplus._M_p = (pointer)&local_208.field_2;
  }
  else {
    local_208.field_2._M_allocated_capacity = *psVar6;
    local_208._M_dataplus._M_p = (pointer)*plVar5;
  }
  local_208._M_string_length = plVar5[1];
  *plVar5 = (long)psVar6;
  plVar5[1] = 0;
  *(undefined1 *)(plVar5 + 2) = 0;
  pcVar2 = local_1a8 + 0x10;
  if ((pointer)local_1a8._0_8_ != pcVar2) {
    operator_delete((void *)local_1a8._0_8_,local_1a8._16_8_ + 1);
  }
  if (local_248[0] != local_238) {
    operator_delete(local_248[0],local_238[0] + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_228._M_dataplus._M_p != paVar1) {
    operator_delete(local_228._M_dataplus._M_p,local_228.field_2._M_allocated_capacity + 1);
  }
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1a8,"/",
                 packageName);
  std::__cxx11::string::_M_append((char *)local_1e8,local_1a8._0_8_);
  if ((pointer)local_1a8._0_8_ != pcVar2) {
    operator_delete((void *)local_1a8._0_8_,local_1a8._16_8_ + 1);
  }
  local_1a8._0_8_ = pcVar2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_1a8,"CPACK_TEMPORARY_DIRECTORY","");
  cmCPackGenerator::SetOption
            (&this->super_cmCPackGenerator,(string *)local_1a8,(char *)local_1e8[0]);
  if ((pointer)local_1a8._0_8_ != pcVar2) {
    operator_delete((void *)local_1a8._0_8_,local_1a8._16_8_ + 1);
  }
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1a8,"/",
                 &local_208);
  std::__cxx11::string::_M_append((char *)&local_1c8,local_1a8._0_8_);
  if ((pointer)local_1a8._0_8_ != pcVar2) {
    operator_delete((void *)local_1a8._0_8_,local_1a8._16_8_ + 1);
  }
  local_1a8._0_8_ = pcVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1a8,"CPACK_OUTPUT_FILE_NAME","");
  cmCPackGenerator::SetOption
            (&this->super_cmCPackGenerator,(string *)local_1a8,local_208._M_dataplus._M_p);
  if ((pointer)local_1a8._0_8_ != pcVar2) {
    operator_delete((void *)local_1a8._0_8_,local_1a8._16_8_ + 1);
  }
  local_1a8._0_8_ = pcVar2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_1a8,"CPACK_TEMPORARY_PACKAGE_FILE_NAME","");
  cmCPackGenerator::SetOption
            (&this->super_cmCPackGenerator,(string *)local_1a8,local_1c8._M_dataplus._M_p);
  if ((pointer)local_1a8._0_8_ != pcVar2) {
    operator_delete((void *)local_1a8._0_8_,local_1a8._16_8_ + 1);
  }
  local_1a8._0_8_ = pcVar2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_1a8,"CPACK_RPM_PACKAGE_COMPONENT","");
  cmCPackGenerator::SetOption
            (&this->super_cmCPackGenerator,(string *)local_1a8,(packageName->_M_dataplus)._M_p);
  if ((pointer)local_1a8._0_8_ != pcVar2) {
    operator_delete((void *)local_1a8._0_8_,local_1a8._16_8_ + 1);
  }
  local_248[0] = local_238;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_248,"/","");
  std::__cxx11::string::_M_append((char *)local_248,(ulong)(packageName->_M_dataplus)._M_p);
  local_1a8._0_8_ = pcVar2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_1a8,"CPACK_RPM_PACKAGE_COMPONENT_PART_PATH","");
  cmCPackGenerator::SetOption
            (&this->super_cmCPackGenerator,(string *)local_1a8,(char *)local_248[0]);
  if ((pointer)local_1a8._0_8_ != pcVar2) {
    operator_delete((void *)local_1a8._0_8_,local_1a8._16_8_ + 1);
  }
  bVar3 = cmCPackGenerator::ReadListFile(&this->super_cmCPackGenerator,"CPackRPM.cmake");
  iVar7 = 1;
  if (!bVar3) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1a8,"Error while execution CPackRPM.cmake",0x24);
    std::ios::widen((char)(ostream *)local_1a8 + (char)*(undefined8 *)(local_1a8._0_8_ + -0x18));
    std::ostream::put((char)local_1a8);
    std::ostream::flush();
    this_00 = (this->super_cmCPackGenerator).Logger;
    std::__cxx11::stringbuf::str();
    msg._M_p = local_228._M_dataplus._M_p;
    length = strlen(local_228._M_dataplus._M_p);
    cmCPackLog::Log(this_00,0x10,
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/fjeremic[P]CMake/Source/CPack/cmCPackRPMGenerator.cxx"
                    ,0x58,msg._M_p,length);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_228._M_dataplus._M_p != paVar1) {
      operator_delete(local_228._M_dataplus._M_p,local_228.field_2._M_allocated_capacity + 1);
    }
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
    std::ios_base::~ios_base(local_138);
    iVar7 = 0;
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back(&(this->super_cmCPackGenerator).packageFileNames,&local_1c8);
  if (local_248[0] != local_238) {
    operator_delete(local_248[0],local_238[0] + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_208._M_dataplus._M_p != &local_208.field_2) {
    operator_delete(local_208._M_dataplus._M_p,local_208.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1c8._M_dataplus._M_p != &local_1c8.field_2) {
    operator_delete(local_1c8._M_dataplus._M_p,local_1c8.field_2._M_allocated_capacity + 1);
  }
  if (local_1e8[0] != local_1d8) {
    operator_delete(local_1e8[0],local_1d8[0] + 1);
  }
  return iVar7;
}

Assistant:

int cmCPackRPMGenerator::PackageOnePack(std::string initialToplevel,
                                        std::string packageName)
{
  int retval = 1;
  // Begin the archive for this pack
  std::string localToplevel(initialToplevel);
  std::string packageFileName(
      cmSystemTools::GetParentDirectory(toplevel)
                             );
  std::string outputFileName(
   GetComponentPackageFileName(this->GetOption("CPACK_PACKAGE_FILE_NAME"),
                               packageName,
                               true)
                               + this->GetOutputExtension()
                            );

  localToplevel += "/"+ packageName;
  /* replace the TEMP DIRECTORY with the component one */
  this->SetOption("CPACK_TEMPORARY_DIRECTORY",localToplevel.c_str());
  packageFileName += "/"+ outputFileName;
  /* replace proposed CPACK_OUTPUT_FILE_NAME */
  this->SetOption("CPACK_OUTPUT_FILE_NAME",outputFileName.c_str());
  /* replace the TEMPORARY package file name */
  this->SetOption("CPACK_TEMPORARY_PACKAGE_FILE_NAME",
                  packageFileName.c_str());
  // Tell CPackRPM.cmake the name of the component NAME.
  this->SetOption("CPACK_RPM_PACKAGE_COMPONENT",packageName.c_str());
  // Tell CPackRPM.cmake the path where the component is.
  std::string component_path = "/";
  component_path += packageName;
  this->SetOption("CPACK_RPM_PACKAGE_COMPONENT_PART_PATH",
                  component_path.c_str());
  if (!this->ReadListFile("CPackRPM.cmake"))
    {
    cmCPackLogger(cmCPackLog::LOG_ERROR,
        "Error while execution CPackRPM.cmake" << std::endl);
    retval = 0;
    }
  // add the generated package to package file names list
  packageFileNames.push_back(packageFileName);
  return retval;
}